

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_rawequal(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  TRef TVar2;
  int diff;
  TRef trb;
  TRef tra;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  if ((*J->base != 0) && (J->base[1] != 0)) {
    iVar1 = lj_record_objcmp(J,*J->base,J->base[1],rd->argv,rd->argv + 1);
    TVar2 = 0x2007ffd;
    if (iVar1 != 0) {
      TVar2 = 0x1007ffe;
    }
    *J->base = TVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawequal(jit_State *J, RecordFFData *rd)
{
  TRef tra = J->base[0];
  TRef trb = J->base[1];
  if (tra && trb) {
    int diff = lj_record_objcmp(J, tra, trb, &rd->argv[0], &rd->argv[1]);
    J->base[0] = diff ? TREF_FALSE : TREF_TRUE;
  }  /* else: Interpreter will throw. */
}